

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QFontDatabasePrivate::ApplicationFont>::reallocateAndGrow
          (QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  ApplicationFont *pAVar3;
  qsizetype qVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> *)0x0 &&
         where == GrowsAtEnd) && (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0))
      && (0 < n)) && ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar6 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,0x48,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                        -0x71c71c71c71c71c7,Grow);
    this->d = (Data *)auVar6._0_8_;
    this->ptr = (ApplicationFont *)auVar6._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (ApplicationFont *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar5 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QtPrivate::QGenericArrayOps<QFontDatabasePrivate::ApplicationFont>::copyAppend
                  ((QGenericArrayOps<QFontDatabasePrivate::ApplicationFont> *)&local_38,this->ptr,
                   this->ptr + lVar5);
      }
      else {
        QtPrivate::QGenericArrayOps<QFontDatabasePrivate::ApplicationFont>::moveAppend
                  ((QGenericArrayOps<QFontDatabasePrivate::ApplicationFont> *)&local_38,this->ptr,
                   this->ptr + lVar5);
      }
    }
    pDVar2 = this->d;
    pAVar3 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar4 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pAVar3;
    local_38.size = qVar4;
    if (old != (QArrayDataPointer<QFontDatabasePrivate::ApplicationFont> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar2;
      old->ptr = pAVar3;
      local_38.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }